

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setHintingPreference(QFont *this,HintingPreference hintingPreference)

{
  QFontPrivate *pQVar1;
  uint in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((*(uint *)(in_RDI + 8) & 0x8000) == 0) ||
     (pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711df2),
     ((uint)(*(ulong *)&(pQVar1->request).field_0x60 >> 0x1e) & 3) != in_ESI)) {
    detach((QFont *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711e22);
    *(ulong *)&(pQVar1->request).field_0x60 =
         *(ulong *)&(pQVar1->request).field_0x60 & 0xffffffff3fffffff | ((ulong)in_ESI & 3) << 0x1e;
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x8000;
  }
  return;
}

Assistant:

void QFont::setHintingPreference(HintingPreference hintingPreference)
{
    if ((resolve_mask & QFont::HintingPreferenceResolved) && d->request.hintingPreference == hintingPreference)
        return;

    detach();

    d->request.hintingPreference = hintingPreference;

    resolve_mask |= QFont::HintingPreferenceResolved;
}